

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O0

void __thiscall
jaegertracing::Span::SetBaggageItem(Span *this,string_view restrictedKey,string_view value)

{
  __node_base_ptr this_00;
  element_type *this_01;
  StrMap *pSVar1;
  SpanContext local_170;
  Span *local_c0;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  StrMap baggage;
  BaggageSetter *baggageSetter;
  lock_guard<std::mutex> lock;
  Span *this_local;
  string_view value_local;
  string_view restrictedKey_local;
  
  value_local.length_ = (size_t)restrictedKey.data_;
  value_local.data_ = (char *)value.length_;
  this_local = (Span *)value.data_;
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&baggageSetter,&this->_mutex);
  this_01 = std::
            __shared_ptr_access<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_tracer);
  baggage._M_h._M_single_bucket = (__node_base_ptr)Tracer::baggageSetter(this_01);
  pSVar1 = SpanContext::baggage_abi_cxx11_(&this->_context);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_78,pSVar1);
  this_00 = baggage._M_h._M_single_bucket;
  opentracing::v3::string_view::operator_cast_to_string
            (&local_98,(string_view *)&value_local.length_);
  opentracing::v3::string_view::operator_cast_to_string(&local_b8,(string_view *)&this_local);
  local_c0 = this;
  jaegertracing::baggage::BaggageSetter::
  setBaggage<jaegertracing::Span::SetBaggageItem(opentracing::v3::string_view,opentracing::v3::string_view)::__0>
            ((BaggageSetter *)this_00,this,(StrMap *)local_78,&local_98,&local_b8,
             (anon_class_8_1_8991fb9c)this);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  SpanContext::withBaggage(&local_170,&this->_context,(StrMap *)local_78);
  SpanContext::operator=(&this->_context,&local_170);
  SpanContext::~SpanContext(&local_170);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_78);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&baggageSetter);
  return;
}

Assistant:

void Span::SetBaggageItem(opentracing::string_view restrictedKey,
                          opentracing::string_view value) noexcept
{
    std::lock_guard<std::mutex> lock(_mutex);
    const auto& baggageSetter = _tracer->baggageSetter();
    auto baggage = _context.baggage();
    baggageSetter.setBaggage(*this,
                             baggage,
                             restrictedKey,
                             value,
                             [this](std::vector<Tag>::const_iterator first,
                                    std::vector<Tag>::const_iterator last) {
                                 logFieldsNoLocking(SystemClock::now(), first, last);
                             });
    _context = _context.withBaggage(baggage);
}